

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O1

void tchecker::dbm::universal_positive(db_t *dbm,clock_id_t dim)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  clock_id_t i;
  ulong uVar4;
  ulong uVar5;
  db_t dVar6;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x34,
                  "void tchecker::dbm::universal_positive(tchecker::dbm::db_t *, tchecker::clock_id_t)"
                 );
  }
  uVar1 = (ulong)dim;
  if (dim == 0) {
    __assert_fail("dim >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x35,
                  "void tchecker::dbm::universal_positive(tchecker::dbm::db_t *, tchecker::clock_id_t)"
                 );
  }
  lVar3 = 0;
  uVar4 = 0;
  do {
    uVar5 = 0;
    do {
      dVar6 = (db_t)0x7ffffffe;
      if (uVar4 == uVar5) {
        dVar6 = (db_t)0x1;
      }
      if (uVar4 == 0) {
        dVar6 = (db_t)0x1;
      }
      dbm[(uint)((int)lVar3 + (int)uVar5)] = dVar6;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + uVar1;
  } while (uVar4 != uVar1);
  bVar2 = is_consistent(dbm,dim);
  if (!bVar2) {
    __assert_fail("tchecker::dbm::is_consistent(dbm, dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x39,
                  "void tchecker::dbm::universal_positive(tchecker::dbm::db_t *, tchecker::clock_id_t)"
                 );
  }
  bVar2 = is_positive(dbm,dim);
  if (!bVar2) {
    __assert_fail("tchecker::dbm::is_positive(dbm, dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x3a,
                  "void tchecker::dbm::universal_positive(tchecker::dbm::db_t *, tchecker::clock_id_t)"
                 );
  }
  bVar2 = is_tight(dbm,dim);
  if (bVar2) {
    return;
  }
  __assert_fail("tchecker::dbm::is_tight(dbm, dim)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,0x3b,
                "void tchecker::dbm::universal_positive(tchecker::dbm::db_t *, tchecker::clock_id_t)"
               );
}

Assistant:

void universal_positive(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  for (tchecker::clock_id_t i = 0; i < dim; ++i)
    for (tchecker::clock_id_t j = 0; j < dim; ++j)
      DBM(i, j) = ((i == j) || (i == 0) ? tchecker::dbm::LE_ZERO : tchecker::dbm::LT_INFINITY);
  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_positive(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));
}